

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::StateRecorder::Impl::add_module_identifier
               (VkPipelineShaderStageCreateInfo *info,ScratchAllocator *alloc,VkDevice device,
               PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)

{
  VkShaderModuleCreateInfo *pVVar1;
  VkShaderModuleIdentifierEXT *pVVar2;
  undefined4 *puVar3;
  VkBaseInStructure *base_in;
  
  if (gsmcii != (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0 && device != (VkDevice)0x0) {
    for (pVVar1 = (VkShaderModuleCreateInfo *)info->pNext; pVVar1 != (VkShaderModuleCreateInfo *)0x0
        ; pVVar1 = (VkShaderModuleCreateInfo *)pVVar1->pNext) {
      if (pVVar1->sType == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) {
        pVVar2 = (VkShaderModuleIdentifierEXT *)ScratchAllocator::allocate_raw(alloc,0x38,0x10);
        if (pVVar2 != (VkShaderModuleIdentifierEXT *)0x0) {
          pVVar2->identifier[0x10] = '\0';
          pVVar2->identifier[0x11] = '\0';
          pVVar2->identifier[0x12] = '\0';
          pVVar2->identifier[0x13] = '\0';
          pVVar2->identifier[0x14] = '\0';
          pVVar2->identifier[0x15] = '\0';
          pVVar2->identifier[0x16] = '\0';
          pVVar2->identifier[0x17] = '\0';
          pVVar2->identifier[0x18] = '\0';
          pVVar2->identifier[0x19] = '\0';
          pVVar2->identifier[0x1a] = '\0';
          pVVar2->identifier[0x1b] = '\0';
          pVVar2->identifier[0x1c] = '\0';
          pVVar2->identifier[0x1d] = '\0';
          pVVar2->identifier[0x1e] = '\0';
          pVVar2->identifier[0x1f] = '\0';
          pVVar2->identifier[0] = '\0';
          pVVar2->identifier[1] = '\0';
          pVVar2->identifier[2] = '\0';
          pVVar2->identifier[3] = '\0';
          pVVar2->identifier[4] = '\0';
          pVVar2->identifier[5] = '\0';
          pVVar2->identifier[6] = '\0';
          pVVar2->identifier[7] = '\0';
          pVVar2->identifier[8] = '\0';
          pVVar2->identifier[9] = '\0';
          pVVar2->identifier[10] = '\0';
          pVVar2->identifier[0xb] = '\0';
          pVVar2->identifier[0xc] = '\0';
          pVVar2->identifier[0xd] = '\0';
          pVVar2->identifier[0xe] = '\0';
          pVVar2->identifier[0xf] = '\0';
          *(undefined8 *)&pVVar2->field_0x4 = 0;
          *(undefined8 *)((long)&pVVar2->pNext + 4) = 0;
          *(undefined4 *)&pVVar2->field_0x34 = 0;
          pVVar2->sType = VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT;
          (*gsmcii)(device,pVVar1,pVVar2);
          puVar3 = (undefined4 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
          if (puVar3 != (undefined4 *)0x0) {
            *(undefined8 *)(puVar3 + 1) = 0;
            *(undefined8 *)(puVar3 + 3) = 0;
            puVar3[5] = 0;
            *puVar3 = 0x3ba1d6b2;
            *(uint8_t **)(puVar3 + 6) = pVVar2->identifier;
            puVar3[4] = pVVar2->identifierSize;
            *(void **)(puVar3 + 2) = info->pNext;
            info->pNext = puVar3;
            return true;
          }
        }
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool StateRecorder::Impl::add_module_identifier(
		VkPipelineShaderStageCreateInfo *info, ScratchAllocator &alloc,
		VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)
{
	if (!device || !gsmcii)
		return true;

	if (auto *module_info = find_pnext<VkShaderModuleCreateInfo>(VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO,
	                                                             info->pNext))
	{
		auto *ident = alloc.allocate_cleared<VkShaderModuleIdentifierEXT>();
		if (!ident)
			return false;
		ident->sType = VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT;
		gsmcii(device, module_info, ident);

		auto *identifier_create_info = alloc.allocate_cleared<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>();
		if (!identifier_create_info)
			return false;

		identifier_create_info->sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT;
		identifier_create_info->pIdentifier = ident->identifier;
		identifier_create_info->identifierSize = ident->identifierSize;

		identifier_create_info->pNext = info->pNext;
		info->pNext = identifier_create_info;
	}

	return true;
}